

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall QSocks5SocketEnginePrivate::reauthenticate(QSocks5SocketEnginePrivate *this)

{
  QNetworkProxy *proxy;
  QAbstractSocketEngine *this_00;
  QTcpSocket *pQVar1;
  QObject *pQVar2;
  quint16 qVar3;
  QSocks5Authenticator *pQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QAuthenticator auth;
  QString local_78;
  QAuthenticator local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketEngine **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  local_60.d = (QAuthenticatorPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QAuthenticator::QAuthenticator(&local_60);
  proxy = &this->proxyInfo;
  QAbstractSocketEngine::proxyAuthenticationRequired(this_00,proxy,&local_60);
  QAuthenticator::user(&local_58,&local_60);
  bVar5 = true;
  if (local_58.d.size == 0) {
    QAuthenticator::password(&local_78,&local_60);
    bVar5 = local_78.d.size != 0;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar5) {
    this->socks5State = Uninitialized;
    pQVar4 = this->data->authenticator;
    if (pQVar4 != (QSocks5Authenticator *)0x0) {
      (*pQVar4->_vptr_QSocks5Authenticator[1])();
    }
    QAuthenticator::user(&local_58,&local_60);
    QNetworkProxy::setUser(proxy,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    QAuthenticator::password(&local_58,&local_60);
    QNetworkProxy::setPassword(proxy,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar4 = (QSocks5Authenticator *)operator_new(0x38);
    QNetworkProxy::user(&local_58,proxy);
    QNetworkProxy::password(&local_78,proxy);
    pQVar4->_vptr_QSocks5Authenticator = (_func_int **)&PTR__QSocks5PasswordAuthenticator_002d0290;
    pQVar4[1]._vptr_QSocks5Authenticator = (_func_int **)0x0;
    pQVar4[2]._vptr_QSocks5Authenticator = (_func_int **)0x0;
    pQVar4[3]._vptr_QSocks5Authenticator = (_func_int **)0x0;
    pQVar4[4]._vptr_QSocks5Authenticator = (_func_int **)0x0;
    pQVar4[5]._vptr_QSocks5Authenticator = (_func_int **)0x0;
    pQVar4[6]._vptr_QSocks5Authenticator = (_func_int **)0x0;
    QString::operator=((QString *)(pQVar4 + 1),(QString *)&local_58);
    QString::operator=((QString *)(pQVar4 + 4),(QString *)&local_78);
    this->data->authenticator = pQVar4;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar1 = this->data->controlSocket;
    if (pQVar1 == (QTcpSocket *)0x0) {
      QAbstractSocket::abort((QAbstractSocket *)0x0);
    }
    else {
      bVar5 = SUB81(pQVar1,0);
      QObject::blockSignals(bVar5);
      QAbstractSocket::abort(&this->data->controlSocket->super_QAbstractSocket);
      QObject::blockSignals(bVar5);
    }
    pQVar1 = this->data->controlSocket;
    QNetworkProxy::hostName(&local_58,proxy);
    qVar3 = QNetworkProxy::port(proxy);
    (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0xf8))(pQVar1,&local_58,qVar3,3,2);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    setErrorState(this,AuthenticatingError,&local_58);
    (**(code **)(*(long *)&this->data->controlSocket->super_QAbstractSocket + 0x70))();
    pQVar2 = *(QObject **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
    this->connectionNotificationPending = true;
    local_58.d.size = 0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    QMetaObject::invokeMethodImpl
              (pQVar2,"_q_emitPendingConnectionNotification",QueuedConnection,1,(void **)&local_58,
               (char **)&local_58.d.ptr,(QMetaTypeInterface **)&local_58.d.size);
  }
  QAuthenticator::~QAuthenticator(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::reauthenticate()
{
    Q_Q(QSocks5SocketEngine);

    // we require authentication
    QAuthenticator auth;
    q->proxyAuthenticationRequired(proxyInfo, &auth);

    if (!auth.user().isEmpty() || !auth.password().isEmpty()) {
        // we have new credentials, let's try again
        QSOCKS5_DEBUG << "authentication failure: retrying connection";
        socks5State = QSocks5SocketEnginePrivate::Uninitialized;

        delete data->authenticator;
        proxyInfo.setUser(auth.user());
        proxyInfo.setPassword(auth.password());
        data->authenticator = new QSocks5PasswordAuthenticator(proxyInfo.user(), proxyInfo.password());

        {
            const QSignalBlocker blocker(data->controlSocket);
            data->controlSocket->abort();
        }
        data->controlSocket->connectToHost(proxyInfo.hostName(), proxyInfo.port());
    } else {
        // authentication failure

        setErrorState(AuthenticatingError);
        data->controlSocket->close();
        emitConnectionNotification();
    }
}